

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture_calcLevelOffset_OffsetOfEachLevelRGB2D_Test::
~ktxTexture_calcLevelOffset_OffsetOfEachLevelRGB2D_Test
          (ktxTexture_calcLevelOffset_OffsetOfEachLevelRGB2D_Test *this)

{
  void *in_RDI;
  
  ~ktxTexture_calcLevelOffset_OffsetOfEachLevelRGB2D_Test
            ((ktxTexture_calcLevelOffset_OffsetOfEachLevelRGB2D_Test *)0x1422a8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(ktxTexture_calcLevelOffset, OffsetOfEachLevelRGB2D) {
    ktxTexture1* ktx1texture = 0;
    ktxTexture2* ktx2texture = 0;
    TestCreateInfo createInfo(9, 9, 1, 2, GL_RGB8,
                              VK_FORMAT_R8G8B8_UNORM, KTX_FALSE, 1, 1);
    KTX_error_code result;
    // Offsets for 9x9, 4 level RGB8 texture.
    // KTX 1: level 0 ... level 4
    ktx_uint32_t ktx1offsets[] = {0, 28*9, 28*9+12*4, 28*9+12*4+8*2};
    // KTX 2: level 0 ... level 4 with mip padding to a 12 byte alignment.
    ktx_uint32_t ktx2offsets[] = {12*4+24, 6*2+12, 3*1+9, 0};

    result = ktxTexture1_Create(&createInfo, KTX_TEXTURE_CREATE_NO_STORAGE,
                                &ktx1texture);
    EXPECT_EQ(result, KTX_SUCCESS);
    ASSERT_TRUE(ktx1texture != NULL) << "ktxTexture1_Create failed: "
                                 << ktxErrorString(result);
    result = ktxTexture2_Create(&createInfo, KTX_TEXTURE_CREATE_NO_STORAGE,
                                &ktx2texture);
    EXPECT_EQ(result, KTX_SUCCESS);
    ASSERT_TRUE(ktx2texture != NULL) << "ktxTexture2_Create failed: "
                                 << ktxErrorString(result);

    for (ktx_uint32_t i = 0; i < createInfo.numLevels; i++) {
        ktx_size_t levelOffset;
        levelOffset = ktxTexture1_calcLevelOffset(ktx1texture, i);
        EXPECT_EQ(levelOffset, ktx1offsets[i]);
        levelOffset = ktxTexture2_calcLevelOffset(ktx2texture, i);
        EXPECT_EQ(levelOffset, ktx2offsets[i]);
    }
    if (ktx1texture)
        ktxTexture_Destroy(ktxTexture(ktx1texture));
    if (ktx2texture)
        ktxTexture_Destroy(ktxTexture(ktx2texture));
}